

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O1

void __thiscall
DbaseCtrlBlk::get_next_trans(DbaseCtrlBlk *this,int **lbuf,int *nitems,int *tid,int *cid)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  unsigned_long uVar4;
  
  iVar1 = this->cur_buf_pos;
  if ((this->cur_blk_size <= (long)iVar1 + 3U) ||
     (this->cur_blk_size < (ulong)(long)(iVar1 + this->buf[(long)iVar1 + 2] + 3))) {
    uVar4 = lseek(this->fd,0,1);
    if (uVar4 == this->endpos) {
      this->readall = '\x01';
    }
    if (this->readall == '\0') {
      get_next_trans_ext(this);
    }
  }
  if (this->readall == '\0') {
    piVar3 = this->buf;
    *cid = piVar3[this->cur_buf_pos];
    *tid = piVar3[(long)this->cur_buf_pos + 1];
    iVar1 = piVar3[(long)this->cur_buf_pos + 2];
    *nitems = iVar1;
    iVar2 = this->cur_buf_pos;
    *lbuf = piVar3 + (long)iVar2 + 3;
    this->cur_buf_pos = iVar1 + iVar2 + 3;
  }
  return;
}

Assistant:

void DbaseCtrlBlk::get_next_trans(int *&lbuf, int &nitems, int &tid, int &cid) {
    if (cur_buf_pos + TRANSOFF >= cur_blk_size ||
        cur_buf_pos + buf[cur_buf_pos + TRANSOFF - 1] + TRANSOFF > cur_blk_size) {
        if (lseek(fd, 0, SEEK_CUR) == endpos) readall = 1;
        if (!readall) {
            // Need to get more items from file
            get_next_trans_ext();
        }
    }

    if (!readall) {
        cid = buf[cur_buf_pos];
        tid = buf[cur_buf_pos + TRANSOFF - 2];
        nitems = buf[cur_buf_pos + TRANSOFF - 1];
        lbuf = buf + cur_buf_pos + TRANSOFF;
        cur_buf_pos += nitems + TRANSOFF;
    }
}